

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O2

error_code slang::OS::readFile(path *path,SmallVector<char,_40UL> *buffer)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  ssize_t sVar6;
  error_category *peVar7;
  size_t __nbytes;
  ulong uVar8;
  pointer __buf;
  long lVar9;
  ulong uVar10;
  error_code eVar11;
  stat status;
  stat local_c0;
  
  bVar2 = std::operator==(&path->_M_pathname,"-");
  iVar3 = 0;
  if (bVar2) {
LAB_002e52c1:
    peVar7 = (error_category *)std::_V2::system_category();
    iVar4 = fstat(iVar3,&local_c0);
    if (iVar4 == 0) {
      if (((short)(local_c0.st_mode & 0xf000) == 0x6000) || ((local_c0.st_mode & 0xf000) == 0x8000))
      {
        SmallVectorBase<char>::resize_for_overwrite
                  (&buffer->super_SmallVectorBase<char>,local_c0.st_size + 1);
        __buf = (buffer->super_SmallVectorBase<char>).data_;
        uVar10 = local_c0.st_size;
        do {
          __nbytes = 0x7fffffff;
          if (uVar10 < 0x7fffffff) {
            __nbytes = uVar10;
          }
          while( true ) {
            uVar8 = 0;
            if (uVar10 == 0) goto LAB_002e53f0;
            sVar6 = read(iVar3,__buf,__nbytes);
            if (-1 < sVar6) break;
            puVar5 = (uint *)__errno_location();
            uVar8 = (ulong)*puVar5;
            if (*puVar5 != 4) {
              peVar7 = (error_category *)std::_V2::generic_category();
              goto LAB_002e53f0;
            }
          }
          __buf = __buf + sVar6;
          uVar10 = uVar10 - sVar6;
        } while (sVar6 != 0);
        SmallVectorBase<char>::resize
                  (&buffer->super_SmallVectorBase<char>,
                   (size_type)(__buf + (1 - (long)(buffer->super_SmallVectorBase<char>).data_)));
      }
      else {
        lVar9 = 0;
        do {
          while( true ) {
            SmallVectorBase<char>::resize_for_overwrite
                      (&buffer->super_SmallVectorBase<char>,lVar9 + 0x4001);
            sVar6 = read(iVar3,(buffer->super_SmallVectorBase<char>).data_ + lVar9,0x4000);
            if (-1 < sVar6) break;
            puVar5 = (uint *)__errno_location();
            uVar8 = (ulong)*puVar5;
            if (*puVar5 != 4) {
              peVar7 = (error_category *)std::_V2::generic_category();
              goto LAB_002e53d8;
            }
          }
          lVar9 = lVar9 + sVar6;
        } while (sVar6 != 0);
        uVar8 = 0;
LAB_002e53d8:
        SmallVectorBase<char>::resize(&buffer->super_SmallVectorBase<char>,lVar9 + 1);
      }
LAB_002e53f0:
      (buffer->super_SmallVectorBase<char>).data_[(buffer->super_SmallVectorBase<char>).len - 1] =
           '\0';
    }
    else {
      puVar5 = (uint *)__errno_location();
      uVar8 = (ulong)*puVar5;
      peVar7 = (error_category *)std::_V2::generic_category();
    }
    if (((bVar2) || (iVar3 = close(iVar3), -1 < iVar3)) || ((int)uVar8 != 0)) goto LAB_002e5424;
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
  }
  else {
    do {
      iVar3 = open((path->_M_pathname)._M_dataplus._M_p,0x80000);
      if (-1 < iVar3) goto LAB_002e52c1;
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
    } while (uVar1 == 4);
  }
  uVar8 = (ulong)uVar1;
  peVar7 = (error_category *)std::_V2::generic_category();
LAB_002e5424:
  eVar11._M_cat = peVar7;
  eVar11._0_8_ = uVar8;
  return eVar11;
}

Assistant:

std::error_code OS::readFile(const fs::path& path, SmallVector<char>& buffer) {
    int fd;
    auto& pathStr = path.native();
    const bool isStdin = pathStr == "-";

    if (isStdin) {
        fd = STDIN_FILENO;
    }
    else {
        while (true) {
            fd = ::open(pathStr.c_str(), O_RDONLY | O_CLOEXEC);
            if (fd >= 0)
                break;

            if (errno != EINTR)
                return std::error_code(errno, std::generic_category());
        }
    }

    std::error_code ec;
    struct stat status;
    if (::fstat(fd, &status) != 0) {
        ec.assign(errno, std::generic_category());
    }
    else if (S_ISREG(status.st_mode) || S_ISBLK(status.st_mode)) {
        auto fileSize = (size_t)status.st_size;
        buffer.resize_for_overwrite(fileSize + 1);

        char* buf = buffer.data();
        while (fileSize) {
            size_t bytesToRead = std::min(fileSize, size_t(INT32_MAX));
            ssize_t numRead = ::read(fd, buf, bytesToRead);
            if (numRead < 0) {
                if (errno == EINTR)
                    continue;

                ec.assign(errno, std::generic_category());
                break;
            }

            buf += numRead;
            fileSize -= (size_t)numRead;
            if (numRead == 0) {
                // We reached the end of the file early -- it must have been
                // truncated by someone else.
                buffer.resize(size_t(buf - buffer.data()) + 1);
                break;
            }
        }

        buffer.back() = '\0';
    }
    else {
        static constexpr size_t ChunkSize = 4 * 4096;

        size_t currSize = 0;
        while (true) {
            buffer.resize_for_overwrite(currSize + ChunkSize + 1);

            ssize_t numRead = ::read(fd, buffer.data() + currSize, ChunkSize);
            if (numRead < 0) {
                if (errno == EINTR)
                    continue;

                ec.assign(errno, std::generic_category());
                break;
            }

            currSize += (size_t)numRead;
            if (numRead == 0)
                break;
        }

        buffer.resize(currSize + 1);
        buffer.back() = '\0';
    }

    if (!isStdin) {
        if (::close(fd) < 0 && !ec)
            ec.assign(errno, std::generic_category());
    }

    return ec;
}